

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

bool __thiscall
YAML::Utils::WriteTagWithPrefix(Utils *this,ostream_wrapper *out,string *prefix,string *tag)

{
  RegEx *pRVar1;
  pointer pRVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  RegEx *pRVar6;
  pointer __n;
  undefined4 uVar7;
  pointer unaff_RBP;
  RegEx *param;
  pointer pRVar8;
  ulong uVar9;
  uint uVar10;
  RegEx *local_R15;
  long lVar11;
  StringCharSource tagBuffer;
  StringCharSource prefixBuffer;
  char local_69;
  string *local_68;
  StringCharSource local_60;
  StringCharSource local_48;
  
  local_68 = prefix;
  ostream_wrapper::write((ostream_wrapper *)this,0x751c61,(void *)0x1,(size_t)tag);
  local_48.m_str =
       (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  __n = (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  local_48.m_offset = 0;
  local_48.m_size = (size_t)__n;
  if (__n != (pointer)0x0) {
    do {
      pRVar6 = Exp::URI();
      if ((0xfffffffd < pRVar6->m_op - REGEX_OR) && (local_48.m_size <= local_48.m_offset))
      goto switchD_0070a555_default;
      switch(pRVar6->m_op) {
      case REGEX_MATCH:
        iVar5 = 1;
        if (local_48.m_str[local_48.m_offset] != pRVar6->m_a) goto switchD_0070a555_default;
        break;
      case REGEX_RANGE:
        bVar3 = 0;
        if ((local_48.m_str[local_48.m_offset] < pRVar6->m_a) ||
           (iVar5 = 1, pRVar6->m_z < local_48.m_str[local_48.m_offset])) goto LAB_0070a88e;
        break;
      case REGEX_OR:
        unaff_RBP = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pRVar8 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          if (unaff_RBP == pRVar8) goto switchD_0070a555_default;
          iVar5 = RegEx::MatchUnchecked<YAML::StringCharSource>(unaff_RBP,&local_48);
          if (-1 < iVar5) break;
          unaff_RBP = unaff_RBP + 1;
        }
        goto LAB_0070a653;
      case REGEX_AND:
        pRVar8 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
            .super__Vector_impl_data._M_finish != pRVar8) {
          iVar5 = -1;
          unaff_RBP = (RegEx *)0x0;
          uVar9 = 0;
          do {
            iVar4 = RegEx::MatchUnchecked<YAML::StringCharSource>
                              ((RegEx *)((long)&unaff_RBP->m_op + (long)&pRVar8->m_op),&local_48);
            if (iVar4 == -1) goto switchD_0070a555_default;
            if (uVar9 == 0) {
              iVar5 = iVar4;
            }
            uVar9 = uVar9 + 1;
            pRVar8 = (pRVar6->m_params).
                     super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                     super__Vector_impl_data._M_start;
            unaff_RBP = unaff_RBP + 1;
          } while (uVar9 < (ulong)((long)(pRVar6->m_params).
                                         super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8
                                  >> 5));
          goto LAB_0070a653;
        }
        goto switchD_0070a555_default;
      case REGEX_NOT:
        pRVar1 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pRVar1 == (pRVar6->m_params).
                      super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto switchD_0070a555_default;
        iVar4 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar1,&local_48);
        iVar5 = 1;
        if (-1 < iVar4) goto switchD_0070a555_default;
        break;
      case REGEX_SEQ:
        iVar5 = RegEx::MatchOpSeq<YAML::StringCharSource>(pRVar6,&local_48);
LAB_0070a653:
        if (iVar5 < 1) goto switchD_0070a555_default;
        break;
      default:
        goto switchD_0070a555_default;
      }
      uVar10 = iVar5 + 1;
      do {
        local_60.m_str = (char *)CONCAT71(local_60.m_str._1_7_,local_48.m_str[local_48.m_offset]);
        __n = local_48.m_str;
        ostream_wrapper::write
                  ((ostream_wrapper *)this,(int)&local_60,(void *)0x1,(size_t)local_48.m_str);
        local_48.m_offset = local_48.m_offset + 1;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    } while (local_48.m_offset < local_48.m_size);
  }
  ostream_wrapper::write((ostream_wrapper *)this,0x751c61,(void *)0x1,(size_t)__n);
  local_60.m_str = (local_68->_M_dataplus)._M_p;
  local_60.m_size = local_68->_M_string_length;
  local_60.m_offset = 0;
  uVar9 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_60.m_size == 0);
  if (local_60.m_size == 0) {
LAB_0070a888:
    bVar3 = 1;
LAB_0070a88e:
    return (bool)(bVar3 & 1);
  }
LAB_0070a6f4:
  pRVar6 = Exp::Tag();
  if ((0xfffffffd < pRVar6->m_op - REGEX_OR) && (local_60.m_size <= local_60.m_offset))
  goto switchD_0070a555_default;
  uVar7 = (undefined4)uVar9;
  switch(pRVar6->m_op) {
  case REGEX_MATCH:
    iVar5 = 1;
    if (local_60.m_str[local_60.m_offset] != pRVar6->m_a) goto switchD_0070a555_default;
    break;
  case REGEX_RANGE:
    bVar3 = 0;
    if ((local_60.m_str[local_60.m_offset] < pRVar6->m_a) ||
       (iVar5 = 1, pRVar6->m_z < local_60.m_str[local_60.m_offset])) goto LAB_0070a88e;
    break;
  case REGEX_OR:
    local_68 = (string *)CONCAT44(local_68._4_4_,uVar7);
    pRVar8 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pRVar8 == pRVar2) goto switchD_0070a555_default;
      iVar5 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar8,&local_60);
      if (-1 < iVar5) break;
      pRVar8 = pRVar8 + 1;
    }
    goto LAB_0070a82f;
  case REGEX_AND:
    pRVar8 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar8) {
      local_68 = (string *)CONCAT44(local_68._4_4_,uVar7);
      iVar5 = -1;
      lVar11 = 0;
      uVar9 = 0;
      do {
        iVar4 = RegEx::MatchUnchecked<YAML::StringCharSource>
                          ((RegEx *)((long)&pRVar8->m_op + lVar11),&local_60);
        if (iVar4 == -1) goto switchD_0070a555_default;
        if (uVar9 == 0) {
          iVar5 = iVar4;
        }
        uVar9 = uVar9 + 1;
        pRVar8 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x20;
      } while (uVar9 < (ulong)((long)(pRVar6->m_params).
                                     super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 5))
      ;
      goto LAB_0070a82f;
    }
switchD_0070a555_default:
    bVar3 = 0;
    goto LAB_0070a88e;
  case REGEX_NOT:
    pRVar1 = (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pRVar1 == (pRVar6->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                  _M_impl.super__Vector_impl_data._M_finish) goto switchD_0070a555_default;
    iVar4 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar1,&local_60);
    iVar5 = 1;
    if (-1 < iVar4) goto switchD_0070a555_default;
    break;
  case REGEX_SEQ:
    local_68 = (string *)CONCAT44(local_68._4_4_,uVar7);
    iVar5 = RegEx::MatchOpSeq<YAML::StringCharSource>(pRVar6,&local_60);
LAB_0070a82f:
    bVar3 = (byte)local_68;
    if (iVar5 < 1) goto LAB_0070a88e;
    break;
  default:
    goto switchD_0070a555_default;
  }
  uVar10 = iVar5 + 1;
  do {
    local_69 = local_60.m_str[local_60.m_offset];
    ostream_wrapper::write
              ((ostream_wrapper *)this,(int)&local_69,(void *)0x1,(size_t)local_60.m_str);
    local_60.m_offset = local_60.m_offset + 1;
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  uVar9 = CONCAT71((int7)(uVar9 >> 8),local_60.m_size <= local_60.m_offset);
  if (local_60.m_size <= local_60.m_offset) goto LAB_0070a888;
  goto LAB_0070a6f4;
}

Assistant:

bool WriteTagWithPrefix(ostream_wrapper& out, const std::string& prefix,
                        const std::string& tag) {
  out << "!";
  StringCharSource prefixBuffer(prefix.c_str(), prefix.size());
  while (prefixBuffer) {
    int n = Exp::URI().Match(prefixBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << prefixBuffer[0];
      ++prefixBuffer;
    }
  }

  out << "!";
  StringCharSource tagBuffer(tag.c_str(), tag.size());
  while (tagBuffer) {
    int n = Exp::Tag().Match(tagBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << tagBuffer[0];
      ++tagBuffer;
    }
  }
  return true;
}